

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::AnchorEnd(void)

{
  int iVar1;
  RegEx *ex2;
  allocator local_49;
  string local_48;
  RegEx local_28;
  
  if (AnchorEnd()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&AnchorEnd()::e);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_48,"?:,]}%@`",&local_49);
      RegEx::RegEx(&local_28,&local_48,REGEX_OR);
      ex2 = BlankOrBreak();
      operator|(&AnchorEnd::e,&local_28,ex2);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      std::__cxx11::string::~string((string *)&local_48);
      __cxa_atexit(RegEx::~RegEx,&AnchorEnd::e,&__dso_handle);
      __cxa_guard_release(&AnchorEnd()::e);
    }
  }
  return &AnchorEnd::e;
}

Assistant:

inline const RegEx& AnchorEnd() {
  static const RegEx e = RegEx("?:,]}%@`", REGEX_OR) | BlankOrBreak();
  return e;
}